

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_purp.cc
# Opt level: O0

int X509_check_issued(X509 *issuer,X509 *subject)

{
  int iVar1;
  X509_NAME *a;
  X509_NAME *b;
  int ret;
  X509 *subject_local;
  X509 *issuer_local;
  
  a = X509_get_subject_name(issuer);
  b = X509_get_issuer_name(subject);
  iVar1 = X509_NAME_cmp(a,b);
  if (iVar1 == 0) {
    iVar1 = x509v3_cache_extensions((X509 *)issuer);
    if ((iVar1 == 0) || (iVar1 = x509v3_cache_extensions((X509 *)subject), iVar1 == 0)) {
      issuer_local._4_4_ = 1;
    }
    else if ((subject->ex_flags == 0) ||
            (issuer_local._4_4_ = X509_check_akid(issuer,(AUTHORITY_KEYID *)subject->ex_flags),
            issuer_local._4_4_ == 0)) {
      if ((((issuer->ex_data).dummy & 2U) == 0) ||
         ((*(uint *)&(issuer->ex_data).field_0xc & 4) != 0)) {
        issuer_local._4_4_ = 0;
      }
      else {
        issuer_local._4_4_ = 0x20;
      }
    }
  }
  else {
    issuer_local._4_4_ = 0x1d;
  }
  return issuer_local._4_4_;
}

Assistant:

int X509_check_issued(X509 *issuer, X509 *subject) {
  if (X509_NAME_cmp(X509_get_subject_name(issuer),
                    X509_get_issuer_name(subject))) {
    return X509_V_ERR_SUBJECT_ISSUER_MISMATCH;
  }
  if (!x509v3_cache_extensions(issuer) || !x509v3_cache_extensions(subject)) {
    return X509_V_ERR_UNSPECIFIED;
  }

  if (subject->akid) {
    int ret = X509_check_akid(issuer, subject->akid);
    if (ret != X509_V_OK) {
      return ret;
    }
  }

  if (ku_reject(issuer, X509v3_KU_KEY_CERT_SIGN)) {
    return X509_V_ERR_KEYUSAGE_NO_CERTSIGN;
  }
  return X509_V_OK;
}